

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void sort_column(Matrix<double> *mat,uint col,uint beg_row,uint end_row)

{
  iterator iVar1;
  iterator iVar2;
  undefined1 local_38 [8];
  vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_> vps;
  uint end_row_local;
  uint beg_row_local;
  uint col_local;
  Matrix<double> *mat_local;
  
  vps.
  super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = end_row;
  get_vps((vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
           *)local_38,mat,col,beg_row,end_row);
  iVar1 = std::
          vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
          ::begin((vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                   *)local_38);
  iVar2 = std::
          vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
          ::end((vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                 *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,double>*,std::vector<std::pair<unsigned_int,double>,std::allocator<std::pair<unsigned_int,double>>>>,sort_column(Matrix<double>&,unsigned_int,unsigned_int,unsigned_int)::__0>
            (iVar1._M_current,iVar2._M_current);
  modify_vps(mat,(vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                  *)local_38,beg_row);
  std::vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>::
  ~vector((vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
           *)local_38);
  return;
}

Assistant:

void sort_column(Matrix_d& mat, unsigned col, unsigned beg_row, unsigned end_row){
    std::vector<std::pair<unsigned, double>> vps=get_vps(mat, col, beg_row, end_row);
    
    std::sort(vps.begin(), vps.end(), 
        [](const std::pair<unsigned, double>& vp1, const std::pair<unsigned, double>& vp2)->bool{
            return vp1.second<vp2.second;
        }
    );

    modify_vps(mat, vps, beg_row);
}